

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O1

void __thiscall json_service::check_method(json_service *this,method_type *m,string *s)

{
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *pvVar1;
  undefined8 uVar2;
  value v;
  istringstream ss;
  value local_190;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)s,_S_in);
  cppcms::json::value::copyable::copyable(&local_190.d);
  cppcms::json::operator>>((istream *)local_188,&local_190);
  pvVar1 = (vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)
           cppcms::json::value::array();
  if ((m->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*m->_M_invoker)((_Any_data *)m,pvVar1);
    cppcms::json::value::copyable::~copyable(&local_190.d);
    std::__cxx11::istringstream::~istringstream(local_188);
    std::ios_base::~ios_base(local_110);
    return;
  }
  uVar2 = std::__throw_bad_function_call();
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  _Unwind_Resume(uVar2);
}

Assistant:

void check_method(method_type const &m,std::string s)
	{
		std::istringstream ss(s);
		cppcms::json::value v;
		ss >> v;
		m(v.array());
	}